

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_crypto.c
# Opt level: O2

void test_archive_md5(void)

{
  int iVar1;
  uchar buf [1];
  archive_md5_ctx ctx;
  uchar actualmd [17];
  uchar md [16];
  
  buf[0] = '\0';
  actualmd[0] = 0x93;
  actualmd[1] = 0xb8;
  actualmd[2] = 0x85;
  actualmd[3] = 0xad;
  actualmd[4] = 0xfe;
  actualmd[5] = '\r';
  actualmd[6] = 0xa0;
  actualmd[7] = 0x89;
  actualmd[8] = 0xcd;
  actualmd[9] = 0xf6;
  actualmd[10] = '4';
  actualmd[0xb] = 0x90;
  actualmd[0xc] = 'O';
  actualmd[0xd] = 0xd5;
  actualmd[0xe] = 0x9f;
  actualmd[0xf] = 'q';
  actualmd[0x10] = '\0';
  iVar1 = __archive_stub_md5init(&ctx);
  if (iVar1 == 0) {
    iVar1 = __archive_stub_md5update(&ctx,buf,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'-',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_md5_update(&ctx, buf, sizeof(buf))",(void *)0x0);
    iVar1 = __archive_stub_md5final(&ctx,md);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_md5_final(&ctx, md)",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'/',md,"md",actualmd,"actualmd",0x10,"sizeof(md)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                   ,L'*');
    test_skipping("This platform does not support MD5");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_md5)
{
	archive_md5_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[16];
	unsigned char actualmd[] = "\x93\xb8\x85\xad\xfe\x0d\xa0\x89"
                             "\xcd\xf6\x34\x90\x4f\xd5\x9f\x71";

	if (ARCHIVE_OK != archive_md5_init(&ctx)) {
		skipping("This platform does not support MD5");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_md5_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_md5_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}